

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O0

void strings_equal<char>(string *n_original,string *iexpected,locale *l,string *domain)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined8 uVar6;
  runtime_error *this;
  int iVar7;
  locale *in_RDX;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss_2;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss_1;
  locale tmp_locale;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  string_type tmp;
  locale tmp_locale_1;
  char *original_c_str;
  string_type original;
  string_type expected;
  basic_message<char> *in_stack_fffffffffffff178;
  basic_message<char> *in_stack_fffffffffffff180;
  basic_message<char> *in_stack_fffffffffffff188;
  string *s;
  runtime_error *in_stack_fffffffffffff190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1a0;
  undefined7 in_stack_fffffffffffff1a8;
  undefined1 in_stack_fffffffffffff1af;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffff1b0;
  string *in_stack_fffffffffffff1c0;
  allocator *paVar8;
  basic_message<char> *in_stack_fffffffffffff1c8;
  undefined1 local_c99 [33];
  string local_c78 [80];
  string *in_stack_fffffffffffff3d8;
  locale local_bb8;
  ostringstream local_bb0 [382];
  undefined1 local_a32;
  allocator local_a31;
  string local_a30 [32];
  string local_a10 [192];
  locale local_950;
  ostringstream local_948 [376];
  locale local_7d0;
  undefined1 local_7c2;
  allocator local_7c1;
  string local_7c0 [160];
  string local_720 [32];
  locale local_700;
  locale local_6f8;
  undefined1 local_6ea;
  allocator local_6e9;
  string local_6e8 [160];
  string local_648 [38];
  undefined1 local_622;
  allocator local_621;
  string local_620 [32];
  string local_600 [160];
  locale local_560;
  ostringstream local_558 [376];
  locale local_3e0;
  undefined1 local_3d2;
  allocator local_3d1;
  string local_3d0 [160];
  string local_330 [38];
  undefined1 local_30a;
  allocator local_309;
  string local_308 [160];
  string local_268 [32];
  locale local_248;
  locale local_240;
  undefined1 local_232;
  allocator local_231;
  string local_230 [160];
  string local_190 [32];
  undefined8 local_170;
  undefined1 local_162;
  allocator local_161;
  string local_160 [160];
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  string local_78 [48];
  locale local_48;
  string local_40 [64];
  
  std::locale::locale(&local_48,in_RDX);
  to_correct_string<char>((string *)in_stack_fffffffffffff188,(locale *)in_stack_fffffffffffff180);
  std::locale::~locale(&local_48);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,pcVar4,&local_99);
  to<char>(in_stack_fffffffffffff3d8);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff180,(char *)in_stack_fffffffffffff178);
  if (bVar1) {
    test_counter = test_counter + 1;
    booster::locale::translate<char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff178);
    booster::locale::basic_message<char>::str_abi_cxx11_
              (in_stack_fffffffffffff188,(locale *)in_stack_fffffffffffff180);
    _Var2 = std::operator==(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
    std::__cxx11::string::~string(local_c0);
    booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff180);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd7);
      poVar5 = std::operator<<(poVar5," bl::translate(original).str(l)==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_162 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_160,"Error limits reached, stopping unit test",&local_161);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff190,(string *)in_stack_fffffffffffff188);
        local_162 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    local_170 = std::__cxx11::string::c_str();
    test_counter = test_counter + 1;
    booster::locale::translate<char>((char *)in_stack_fffffffffffff178);
    booster::locale::basic_message<char>::str_abi_cxx11_
              (in_stack_fffffffffffff188,(locale *)in_stack_fffffffffffff180);
    _Var2 = std::operator==(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
    std::__cxx11::string::~string(local_190);
    booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff180);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd9);
      poVar5 = std::operator<<(poVar5," bl::translate(original_c_str).str(l)==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_232 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_230,"Error limits reached, stopping unit test",&local_231);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff190,(string *)in_stack_fffffffffffff188);
        local_232 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::locale::locale(&local_240);
    std::locale::global(&local_248);
    std::locale::~locale(&local_248);
    booster::locale::translate<char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff178);
    booster::locale::basic_message::operator_cast_to_string(in_stack_fffffffffffff178);
    booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff180);
    test_counter = test_counter + 1;
    _Var2 = std::operator==(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xdd);
      poVar5 = std::operator<<(poVar5," tmp==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_30a = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_308,"Error limits reached, stopping unit test",&local_309);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff190,(string *)in_stack_fffffffffffff188);
        local_30a = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    booster::locale::translate<char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff178);
    booster::locale::basic_message<char>::str_abi_cxx11_
              ((basic_message<char> *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8))
    ;
    std::__cxx11::string::operator=(local_268,local_330);
    std::__cxx11::string::~string(local_330);
    booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff180);
    test_counter = test_counter + 1;
    _Var2 = std::operator==(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xdf);
      poVar5 = std::operator<<(poVar5," tmp==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_3d2 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3d0,"Error limits reached, stopping unit test",&local_3d1);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff190,(string *)in_stack_fffffffffffff188);
        local_3d2 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::locale::global(&local_3e0);
    std::locale::~locale(&local_3e0);
    std::__cxx11::ostringstream::ostringstream(local_558);
    std::ios::imbue(&local_560);
    std::locale::~locale(&local_560);
    booster::locale::translate<char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff178);
    booster::locale::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff180,
               in_stack_fffffffffffff178);
    booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff180);
    test_counter = test_counter + 1;
    std::__cxx11::ostringstream::str();
    _Var2 = std::operator==(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
    std::__cxx11::string::~string(local_600);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe5);
      poVar5 = std::operator<<(poVar5," ss.str()==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_622 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_620,"Error limits reached, stopping unit test",&local_621);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff190,(string *)in_stack_fffffffffffff188);
        local_622 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::ostringstream::~ostringstream(local_558);
    std::__cxx11::string::~string(local_268);
    std::locale::~locale(&local_240);
  }
  test_counter = test_counter + 1;
  booster::locale::translate<char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff178);
  booster::locale::basic_message<char>::str
            ((basic_message<char> *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8),
             (locale *)in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
  _Var2 = std::operator==(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
  std::__cxx11::string::~string(local_648);
  booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff180);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe7);
    poVar5 = std::operator<<(poVar5," bl::translate(original).str(l,domain)==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_6ea = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6e8,"Error limits reached, stopping unit test",&local_6e9);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff190,(string *)in_stack_fffffffffffff188);
      local_6ea = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::locale(&local_6f8);
  std::locale::global(&local_700);
  std::locale::~locale(&local_700);
  test_counter = test_counter + 1;
  booster::locale::translate<char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff178);
  booster::locale::basic_message<char>::str(in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0);
  _Var2 = std::operator==(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
  std::__cxx11::string::~string(local_720);
  booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff180);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xea);
    poVar5 = std::operator<<(poVar5," bl::translate(original).str(domain)==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_7c2 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7c0,"Error limits reached, stopping unit test",&local_7c1);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff190,(string *)in_stack_fffffffffffff188);
      local_7c2 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::global(&local_7d0);
  std::locale::~locale(&local_7d0);
  std::__cxx11::ostringstream::ostringstream(local_948);
  std::ios::imbue(&local_950);
  std::locale::~locale(&local_950);
  booster::locale::as::domain((string *)in_stack_fffffffffffff188);
  booster::locale::as::details::operator<<
            (in_stack_fffffffffffff1b0,
             (set_domain *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8));
  booster::locale::translate<char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff178);
  booster::locale::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff180,
             in_stack_fffffffffffff178);
  booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff180);
  booster::locale::as::details::set_domain::~set_domain((set_domain *)0x125d29);
  test_counter = test_counter + 1;
  std::__cxx11::ostringstream::str();
  _Var2 = std::operator==(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
  std::__cxx11::string::~string(local_a10);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf0);
    poVar5 = std::operator<<(poVar5," ss.str()==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_a32 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      paVar8 = &local_a31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a30,"Error limits reached, stopping unit test",paVar8);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff190,(string *)in_stack_fffffffffffff188);
      local_a32 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_948);
  std::__cxx11::ostringstream::ostringstream(local_bb0);
  std::ios::imbue(&local_bb8);
  std::locale::~locale(&local_bb8);
  booster::locale::as::domain((string *)in_stack_fffffffffffff188);
  booster::locale::as::details::operator<<
            (in_stack_fffffffffffff1b0,
             (set_domain *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8));
  std::__cxx11::string::c_str();
  booster::locale::translate<char>((char *)in_stack_fffffffffffff178);
  booster::locale::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff180,
             in_stack_fffffffffffff178);
  booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff180);
  booster::locale::as::details::set_domain::~set_domain((set_domain *)0x126014);
  test_counter = test_counter + 1;
  std::__cxx11::ostringstream::str();
  bVar3 = std::operator==(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
  std::__cxx11::string::~string(local_c78);
  if ((bVar3 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf6);
    this = (runtime_error *)std::operator<<(poVar5," ss.str()==expected");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      uVar6 = __cxa_allocate_exception(0x30);
      s = (string *)local_c99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_c99 + 1),"Error limits reached, stopping unit test",(allocator *)s
                );
      booster::runtime_error::runtime_error(this,s);
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_bb0);
  std::locale::~locale(&local_6f8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void strings_equal(std::string n_original,std::string iexpected,std::locale const &l,std::string domain)
{
    typedef std::basic_string<Char> string_type;
    string_type expected=to_correct_string<Char>(iexpected,l);
    string_type original = to<Char>(n_original.c_str());
    if(domain=="default") {
        TEST(bl::translate(original).str(l)==expected);
        Char const *original_c_str=original.c_str(); // workaround gcc-3.4 bug
        TEST(bl::translate(original_c_str).str(l)==expected);
        std::locale tmp_locale=std::locale();
        std::locale::global(l);
        string_type tmp=bl::translate(original);
        TEST(tmp==expected);
        tmp=bl::translate(original).str();
        TEST(tmp==expected);
        std::locale::global(tmp_locale);

        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::translate(original);
        TEST(ss.str()==expected);
    }
    TEST(bl::translate(original).str(l,domain)==expected);
    std::locale tmp_locale=std::locale();
    std::locale::global(l);
    TEST(bl::translate(original).str(domain)==expected);
    std::locale::global(tmp_locale);
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(original);
        TEST(ss.str()==expected);
    }
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(original.c_str());
        TEST(ss.str()==expected);
    }
}